

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O1

void __thiscall gui::RadioButton::uncheckRadioButtons(RadioButton *this)

{
  pointer psVar1;
  element_type *peVar2;
  Container *pCVar3;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar4;
  long lVar5;
  shared_ptr<gui::Widget> *child;
  pointer psVar6;
  
  pCVar3 = Widget::getParent((Widget *)this);
  if (pCVar3 != (Container *)0x0) {
    pCVar3 = Widget::getParent((Widget *)this);
    pvVar4 = ContainerBase::getChildren(&pCVar3->super_ContainerBase);
    psVar1 = (pvVar4->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (pvVar4->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      peVar2 = (psVar6->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = __dynamic_cast(peVar2,&Widget::typeinfo,&typeinfo,0);
      }
      if ((lVar5 != 0) && (*(char *)(lVar5 + 0x2e1) == '\x01')) {
        *(undefined1 *)(lVar5 + 0x2e1) = 0;
        Widget::requestRedraw((Widget *)this);
      }
    }
  }
  return;
}

Assistant:

void RadioButton::uncheckRadioButtons() {
    if (getParent() == nullptr) {
        return;
    }
    for (const auto& child : getParent()->getChildren()) {
        auto childButton = dynamic_cast<RadioButton*>(child.get());
        if (childButton != nullptr && childButton->isChecked_) {
            childButton->isChecked_ = false;
            requestRedraw();
        }
    }
}